

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O0

void __thiscall Lib::Deque<Kernel::Clause_*>::push_back(Deque<Kernel::Clause_*> *this,Clause *elem)

{
  bool bVar1;
  Clause *in_RSI;
  Deque<Kernel::Clause_*> *in_RDI;
  Deque<Kernel::Clause_*> *in_stack_00000020;
  
  bVar1 = shouldExpand(in_RDI);
  if (bVar1) {
    expand(in_stack_00000020);
  }
  *in_RDI->_back = in_RSI;
  in_RDI->_back = in_RDI->_back + 1;
  if (in_RDI->_back == in_RDI->_end) {
    in_RDI->_back = in_RDI->_data;
  }
  return;
}

Assistant:

inline
  void push_back(C elem)
  {
    if(shouldExpand()) {
      expand();
    }
    ASS(_back < _end);
    ::new (_back) C(elem);

    _back++;
    if(_back==_end) {
      _back=_data;
    }
    ASS_NEQ(_front, _back);
  }